

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::~Array
          (Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }